

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::ReturnStmt::ReturnStmt
          (ReturnStmt *this,FunctionStmtBlock *func_def,shared_ptr<kratos::Var> *value)

{
  shared_ptr<kratos::Var> *value_local;
  FunctionStmtBlock *func_def_local;
  ReturnStmt *this_local;
  
  Stmt::Stmt(&this->super_Stmt,Return);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005b8218;
  this->func_def_ = func_def;
  std::shared_ptr<kratos::Var>::shared_ptr(&this->value_,value);
  return;
}

Assistant:

ReturnStmt::ReturnStmt(FunctionStmtBlock *func_def, std::shared_ptr<Var> value)
    : Stmt(StatementType::Return), func_def_(func_def), value_(std::move(value)) {}